

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,void>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_char,_std::pair<int,_int>_>_> *alloc_ref)

{
  undefined8 *puVar1;
  void *pvVar2;
  void *pvVar3;
  ctrl_t *pcVar4;
  long lVar5;
  ulong uVar6;
  
  if (7 < this->old_capacity_) {
    __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x856,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<char, std::pair<int, int>>>, Alloc = std::allocator<std::pair<const char, std::pair<int, int>>>]"
                 );
  }
  if ((c->capacity_ < 0x11) && (this->old_capacity_ < c->capacity_)) {
    pvVar2 = (c->heap_or_soo_).heap.slot_array.p;
    pvVar3 = old_slots(this);
    pcVar4 = old_ctrl(this);
    lVar5 = 0;
    for (uVar6 = 0; uVar6 < this->old_capacity_; uVar6 = uVar6 + 1) {
      if (kSentinel < pcVar4[uVar6]) {
        puVar1 = (undefined8 *)((long)pvVar2 + lVar5 + 0xc);
        *(undefined4 *)(puVar1 + 1) = *(undefined4 *)((long)pvVar3 + lVar5 + 8);
        *puVar1 = *(undefined8 *)((long)pvVar3 + lVar5);
      }
      lVar5 = lVar5 + 0xc;
    }
    return;
  }
  __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x858,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<char, std::pair<int, int>>>, Alloc = std::allocator<std::pair<const char, std::pair<int, int>>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    ABSL_SWISSTABLE_ASSERT(old_capacity_ < Group::kWidth / 2);
    ABSL_SWISSTABLE_ASSERT(
        IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    ABSL_SWISSTABLE_ASSERT(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array()) + 1;
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());
    auto* old_ctrl_ptr = old_ctrl();

    for (size_t i = 0; i < old_capacity_; ++i, ++new_slots) {
      if (IsFull(old_ctrl_ptr[i])) {
        SanitizerUnpoisonMemoryRegion(new_slots, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots, old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }